

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdGetEffectiveAddrAndOpMode(INSTRUX *Instrux)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint local_30;
  uint local_2c;
  ND_BOOL has66;
  ND_BOOL d64;
  ND_BOOL f64;
  ND_BOOL w64;
  INSTRUX *Instrux_local;
  
  if ((((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x2) &&
     ((Instrux->Attributes & 0x40000000) != 0)) {
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)((uint)Instrux->Exs & 0xfffffffe);
  }
  bVar2 = false;
  if (((uint)Instrux->Exs & 1) != 0) {
    bVar2 = (Instrux->Attributes & 0x400) == 0;
  }
  bVar3 = false;
  if ((Instrux->Attributes & 2) != 0) {
    bVar3 = *(uint *)Instrux >> 0x1c != 2;
  }
  bVar4 = true;
  if (((Instrux->Attributes & 4) == 0) && (bVar4 = false, (Instrux->Attributes & 2) != 0)) {
    bVar4 = *(uint *)Instrux >> 0x1c == 2;
  }
  if ((((*(uint *)&Instrux->field_0x5 >> 5 & 1) == 0) ||
      ((bVar5 = true, *(int *)&Instrux->field_0x5 < 0 &&
       (bVar5 = true, (Instrux->Attributes & 0x80000) == 0)))) &&
     (bVar5 = false, ((uint)Instrux->Exs >> 7 & 3) == 1)) {
    bVar5 = (Instrux->Attributes & 0x1000000000) != 0;
  }
  uVar1 = *(uint *)Instrux & 3;
  if (uVar1 == 0) {
    if ((Instrux->Attributes & 8) != 0) {
      return 0x80000009;
    }
    *(uint *)Instrux = *(uint *)Instrux & 0xfffff3ff | (uint)bVar5 << 10;
  }
  else if (uVar1 == 1) {
    if ((Instrux->Attributes & 8) != 0) {
      return 0x80000009;
    }
    *(uint *)Instrux = *(uint *)Instrux & 0xfffff3ff | (uint)!bVar5 << 10;
  }
  else {
    if (uVar1 != 2) {
      return 0x80000101;
    }
    if ((Instrux->Attributes & 0x10) != 0) {
      return 0x80000009;
    }
    if (((bVar2) || (bVar3)) || ((bVar4 && (!bVar5)))) {
      local_2c = 2;
    }
    else {
      local_2c = (uint)!bVar5;
    }
    *(uint *)Instrux = *(uint *)Instrux & 0xfffff3ff | local_2c << 10;
    if ((Instrux->Attributes & 0x10000000) == 0) {
      local_30 = *(uint *)Instrux >> 6 & 3;
    }
    else {
      local_30 = 2;
    }
    *(uint *)Instrux = *(uint *)Instrux & 0xffffff3f | local_30 << 6;
  }
  *(ulong *)&Instrux->field_0xc =
       *(ulong *)&Instrux->field_0xc & 0xfffffffffffffff0 |
       (ulong)"\x02\x04\b"[*(uint *)Instrux >> 10 & 3] & 0xf;
  return 0;
}

Assistant:

static NDSTATUS
NdGetEffectiveAddrAndOpMode(
    INSTRUX *Instrux
    )
{
    static const ND_UINT8 szLut[3] = { ND_SIZE_16BIT, ND_SIZE_32BIT, ND_SIZE_64BIT };
    ND_BOOL w64, f64, d64, has66;

    if ((ND_CODE_64 != Instrux->DefCode) && !!(Instrux->Attributes & ND_FLAG_IWO64))
    {
        // Some instructions ignore VEX/EVEX.W field outside 64 bit mode, and treat it as 0.
        Instrux->Exs.w = 0;
    }

    // Extract the flags.
    w64 = (0 != Instrux->Exs.w) && !(Instrux->Attributes & ND_FLAG_WIG);

    // In 64 bit mode, the operand is forced to 64 bit. Size-changing prefixes are ignored.
    f64 = 0 != (Instrux->Attributes & ND_FLAG_F64) && (ND_VEND_AMD != Instrux->VendMode);

    // In 64 bit mode, the operand defaults to 64 bit. No 32 bit form of the instruction exists. Note that on AMD,
    // only default 64 bit operands exist, even for branches - no operand is forced to 64 bit.
    d64 = (0 != (Instrux->Attributes & ND_FLAG_D64)) ||
          (0 != (Instrux->Attributes & ND_FLAG_F64) && (ND_VEND_AMD == Instrux->VendMode));

    // Check if 0x66 is indeed interpreted as a size changing prefix. Note that if 0x66 is a mandatory prefix,
    // then it won't be interpreted as a size changing prefix. However, there is an exception: MOVBE and CRC32
    // have mandatory 0xF2, and 0x66 is in fact a size changing prefix.
    // For legacy instructions promoted to EVEX, in some cases, the compressed prefix pp has the same meaning
    // as the legacy 0x66 prefix.
    has66 = (Instrux->HasOpSize && (!Instrux->HasMandatory66 || (Instrux->Attributes & ND_FLAG_S66))) || 
            ((Instrux->Exs.p == 1) && (Instrux->Attributes & ND_FLAG_SCALABLE));

    // Fill in the effective operand size. Also validate instruction validity in given mode.
    switch (Instrux->DefCode)
    {
    case ND_CODE_16:
        if (Instrux->Attributes & ND_FLAG_O64)
        {
            return ND_STATUS_INVALID_ENCODING_IN_MODE;
        }

        Instrux->EfOpMode = has66 ? ND_OPSZ_32 : ND_OPSZ_16;
        break;
    case ND_CODE_32:
        if (Instrux->Attributes & ND_FLAG_O64)
        {
            return ND_STATUS_INVALID_ENCODING_IN_MODE;
        }

        Instrux->EfOpMode = has66 ? ND_OPSZ_16 : ND_OPSZ_32;
        break;
    case ND_CODE_64:
        // Make sure instruction valid in mode.
        if (Instrux->Attributes & ND_FLAG_I64)
        {
            return ND_STATUS_INVALID_ENCODING_IN_MODE;
        }

        Instrux->EfOpMode = (w64 || f64 || (d64 && !has66)) ? ND_OPSZ_64 : (has66 ? ND_OPSZ_16 : ND_OPSZ_32);
        Instrux->AddrMode = !!(Instrux->Attributes & ND_FLAG_I67) ? ND_ADDR_64 : Instrux->AddrMode;
        break;
    default:
        return ND_STATUS_INVALID_INSTRUX;
    }

    // Fill in the default word length. It can't be more than 8 bytes.
    Instrux->WordLength = szLut[Instrux->EfOpMode];

    return ND_STATUS_SUCCESS;
}